

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_bgr2rgba(uchar *bgr,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  bool bVar1;
  Mat alpha_channel;
  Mat rgb_channels;
  Mat *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Mat *in_stack_ffffffffffffff58;
  undefined4 local_4;
  
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
              (Allocator *)in_stack_ffffffffffffff30);
  bVar1 = Mat::empty(in_stack_ffffffffffffff30);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    Mat::channel_range(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                      );
    from_rgb2bgr((uchar *)rgb_channels._40_8_,rgb_channels.allocator._4_4_,
                 (int)rgb_channels.allocator,rgb_channels._28_4_,(Mat *)rgb_channels.elemsize,
                 (Allocator *)rgb_channels.refcount);
    Mat::channel(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              in_stack_ffffffffffffff3c);
    local_4 = 0;
    Mat::~Mat((Mat *)0x1491b2);
    Mat::~Mat((Mat *)0x1491bc);
  }
  return local_4;
}

Assistant:

static int from_bgr2rgba(const unsigned char* bgr, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 4, 4u, allocator);
    if (m.empty())
        return -100;

    Mat rgb_channels = m.channel_range(0, 3);
    from_rgb2bgr(bgr, w, h, stride, rgb_channels, allocator);

    Mat alpha_channel = m.channel(3);
    alpha_channel.fill(255.f);

    return 0;
}